

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void FTransformWHT_C(int16_t *in,int16_t *out)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int aiStack_78 [4];
  int aiStack_68 [8];
  int32_t tmp [16];
  
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    iVar1 = (int)in[lVar3 * 4 + 0x20] + (int)in[lVar3 * 4];
    iVar2 = (int)in[lVar3 * 4 + 0x30] + (int)in[lVar3 * 4 + 0x10];
    iVar5 = (int)in[lVar3 * 4 + 0x10] - (int)in[lVar3 * 4 + 0x30];
    iVar4 = (int)in[lVar3 * 4] - (int)in[lVar3 * 4 + 0x20];
    *(int *)((long)tmp + lVar3) = iVar2 + iVar1;
    *(int *)((long)tmp + lVar3 + 4) = iVar5 + iVar4;
    *(int *)((long)tmp + lVar3 + 8) = iVar4 - iVar5;
    *(int *)((long)tmp + lVar3 + 0xc) = iVar1 - iVar2;
  }
  for (lVar3 = 0xc; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    iVar1 = tmp[lVar3 + -4] + aiStack_78[lVar3];
    iVar2 = tmp[lVar3] + aiStack_68[lVar3];
    iVar5 = aiStack_68[lVar3] - tmp[lVar3];
    iVar4 = aiStack_78[lVar3] - tmp[lVar3 + -4];
    out[lVar3 + -0xc] = (int16_t)((uint)(iVar2 + iVar1) >> 1);
    out[lVar3 + -8] = (int16_t)((uint)(iVar5 + iVar4) >> 1);
    out[lVar3 + -4] = (int16_t)((uint)(iVar4 - iVar5) >> 1);
    out[lVar3] = (int16_t)((uint)(iVar1 - iVar2) >> 1);
  }
  return;
}

Assistant:

static void FTransformWHT_C(const int16_t* in, int16_t* out) {
  // input is 12b signed
  int32_t tmp[16];
  int i;
  for (i = 0; i < 4; ++i, in += 64) {
    const int a0 = (in[0 * 16] + in[2 * 16]);  // 13b
    const int a1 = (in[1 * 16] + in[3 * 16]);
    const int a2 = (in[1 * 16] - in[3 * 16]);
    const int a3 = (in[0 * 16] - in[2 * 16]);
    tmp[0 + i * 4] = a0 + a1;   // 14b
    tmp[1 + i * 4] = a3 + a2;
    tmp[2 + i * 4] = a3 - a2;
    tmp[3 + i * 4] = a0 - a1;
  }
  for (i = 0; i < 4; ++i) {
    const int a0 = (tmp[0 + i] + tmp[8 + i]);  // 15b
    const int a1 = (tmp[4 + i] + tmp[12+ i]);
    const int a2 = (tmp[4 + i] - tmp[12+ i]);
    const int a3 = (tmp[0 + i] - tmp[8 + i]);
    const int b0 = a0 + a1;    // 16b
    const int b1 = a3 + a2;
    const int b2 = a3 - a2;
    const int b3 = a0 - a1;
    out[ 0 + i] = b0 >> 1;     // 15b
    out[ 4 + i] = b1 >> 1;
    out[ 8 + i] = b2 >> 1;
    out[12 + i] = b3 >> 1;
  }
}